

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

char * name_dot_arc(char *s)

{
  char *__s;
  size_t sVar1;
  char *local_18;
  char *s_local;
  
  local_18 = s;
  if (s == (char *)0x0) {
    local_18 = "";
  }
  __s = basename(local_18);
  sVar1 = strlen(__s);
  if (sVar1 + 4 < 0x101) {
    if (name_dot_arc::newname != (char *)0x0) {
      free(name_dot_arc::newname);
    }
    sVar1 = strlen(local_18);
    name_dot_arc::newname = (char *)malloc(sVar1 + 5);
    if (name_dot_arc::newname == (char *)0x0) {
      s_local = local_18;
    }
    else {
      strcpy(name_dot_arc::newname,local_18);
      strcat(name_dot_arc::newname,".arc");
      s_local = name_dot_arc::newname;
    }
  }
  else {
    s_local = local_18;
  }
  return s_local;
}

Assistant:

char *
name_dot_arc(char *s)
{
	static char *newname = NULL;

	if (!s)
		s = "";

	/*
	 * check that there's room for the extension
	 */
	if (strlen(basename(s)) + sizeof(DOTARC) - 1 > FILENAMELEN)
		return (s);

	/*
	 * free previous allocation (hope it's finished with :-/)
	 */
	if (newname)
		free(newname);
	newname = malloc(strlen(s) + sizeof(DOTARC));
	if (!newname)
		return (s);				/* don't complain */
	strcpy(newname, s);
	strcat(newname, DOTARC);
	return (newname);
}